

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QString * __thiscall QFSCompleter::pathFromIndex(QFSCompleter *this,QModelIndex *index)

{
  bool bVar1;
  ulong uVar2;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFileSystemModel *dirModel;
  QString path;
  QString currentLocation;
  QString *in_stack_ffffffffffffff38;
  QString *lhs;
  int arole;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  QChar local_7c;
  char16_t local_7a;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  QString local_60;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lhs = in_RDI;
  if (*(long *)(in_RSI + 0x10) != 0) {
    QAbstractProxyModel::sourceModel();
    qobject_cast<QFileSystemModel_const*>((QObject *)0x76304e);
  }
  arole = (int)((ulong)in_RSI >> 0x20);
  local_60.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_60.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModel::rootPath();
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data((QModelIndex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                    arole);
  ::QVariant::toString();
  ::QVariant::~QVariant(&local_28);
  bVar1 = QString::isEmpty((QString *)0x7630fa);
  if ((bVar1) ||
     (uVar2 = QString::startsWith((QString *)&local_78,(CaseSensitivity)&local_60), (uVar2 & 1) == 0
     )) {
    QModelIndex::data((QModelIndex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      arole);
    ::QVariant::toString();
    ::QVariant::~QVariant(&local_48);
  }
  else {
    local_7a = (char16_t)QDir::separator();
    bVar1 = ::operator==(lhs,(QChar *)in_stack_ffffffffffffff38);
    if (bVar1) {
      QString::size(&local_60);
      QString::remove((longlong)&local_78,0);
      QString::QString(lhs,in_stack_ffffffffffffff38);
    }
    else {
      QChar::QChar<char16_t,_true>(&local_7c,L'/');
      uVar2 = QString::endsWith((QChar *)&local_60,(uint)(ushort)local_7c.ucs);
      if ((uVar2 & 1) == 0) {
        QString::size(&local_60);
        QString::remove((longlong)&local_78,0);
        QString::QString(lhs,in_stack_ffffffffffffff38);
      }
      else {
        QString::size(&local_60);
        QString::remove((longlong)&local_78,0);
        QString::QString(lhs,in_stack_ffffffffffffff38);
      }
    }
  }
  QString::~QString((QString *)0x76324c);
  QString::~QString((QString *)0x763256);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QFSCompleter::pathFromIndex(const QModelIndex &index) const
{
    const QFileSystemModel *dirModel;
    if (proxyModel)
        dirModel = qobject_cast<const QFileSystemModel *>(proxyModel->sourceModel());
    else
        dirModel = sourceModel;
    QString currentLocation = dirModel->rootPath();
    QString path = index.data(QFileSystemModel::FilePathRole).toString();
    if (!currentLocation.isEmpty() && path.startsWith(currentLocation)) {
#if defined(Q_OS_UNIX)
        if (currentLocation == QDir::separator())
            return path.remove(0, currentLocation.size());
#endif
        if (currentLocation.endsWith(u'/'))
            return path.remove(0, currentLocation.size());
        else
            return path.remove(0, currentLocation.size()+1);
    }
    return index.data(QFileSystemModel::FilePathRole).toString();
}